

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O3

bool __thiscall cmCTestMemCheckHandler::InitializeMemoryChecking(cmCTestMemCheckHandler *this)

{
  string *psVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  cmCTest *pcVar5;
  size_type sVar6;
  pointer pbVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  long *plVar13;
  ostream *poVar14;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var15;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  size_type *psVar18;
  ulong *puVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar20;
  string extraOptions;
  string memoryTesterOptions;
  string suppressionsOption;
  string outputFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string testerName;
  string local_268;
  string local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [8];
  pointer pbStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  (this->MemoryTesterEnvironmentVariable)._M_string_length = 0;
  *(this->MemoryTesterEnvironmentVariable)._M_dataplus._M_p = '\0';
  (this->MemoryTester)._M_string_length = 0;
  *(this->MemoryTester)._M_dataplus._M_p = '\0';
  pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  paVar17 = &local_248.field_2;
  local_248._M_dataplus._M_p = (pointer)paVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"MemoryCheckCommand","");
  cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_248);
  bVar8 = cmsys::SystemTools::FileExists((string *)local_1a8);
  if (local_1a8 != (undefined1  [8])local_198) {
    operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar17) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                             local_248.field_2._M_local_buf[0]) + 1);
  }
  psVar1 = &this->MemoryTester;
  if (bVar8) {
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_248._M_dataplus._M_p = (pointer)paVar17;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"MemoryCheckCommand","");
    cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_248);
    std::__cxx11::string::operator=((string *)psVar1,(string *)local_1a8);
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != paVar17) {
      operator_delete(local_248._M_dataplus._M_p,
                      CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                               local_248.field_2._M_local_buf[0]) + 1);
    }
    cmsys::SystemTools::GetFilenameName((string *)local_1a8,psVar1);
    lVar12 = std::__cxx11::string::find((char *)local_1a8,0x742626,0);
    iVar10 = 1;
    if (lVar12 == -1) {
      pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"MemoryCheckType","");
      cmCTest::GetCTestConfiguration(&local_248,pcVar5,&local_268);
      iVar9 = std::__cxx11::string::compare((char *)&local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != paVar17) {
        operator_delete(local_248._M_dataplus._M_p,
                        CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                 local_248.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,
                        (ulong)(local_268.field_2._M_allocated_capacity + 1));
      }
      if (iVar9 != 0) {
        lVar12 = std::__cxx11::string::find(local_1a8,0x74263f,0);
        iVar10 = 3;
        if (lVar12 == -1) {
          pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"MemoryCheckType","")
          ;
          cmCTest::GetCTestConfiguration(&local_248,pcVar5,&local_268);
          iVar9 = std::__cxx11::string::compare((char *)&local_248);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != paVar17) {
            operator_delete(local_248._M_dataplus._M_p,
                            CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                     local_248.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p,
                            (ulong)(local_268.field_2._M_allocated_capacity + 1));
          }
          if (iVar9 != 0) {
            lVar12 = std::__cxx11::string::find(local_1a8,0x742648,0);
            iVar10 = 2;
            if (lVar12 == -1) {
              lVar12 = std::__cxx11::string::find(local_1a8,0x74264f,0);
              iVar10 = 4;
              if (lVar12 == -1) {
                lVar12 = std::__cxx11::string::find(local_1a8,0x742652,0);
                iVar10 = 5;
                if (lVar12 == -1) {
                  lVar12 = std::__cxx11::string::find(local_1a8,0x742660,0);
                  iVar10 = (uint)(lVar12 != -1) * 5;
                }
              }
            }
          }
        }
      }
    }
    this->MemoryTesterStyle = iVar10;
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
    }
  }
  else {
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_248._M_dataplus._M_p = (pointer)paVar17;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"PurifyCommand","");
    cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_248);
    bVar8 = cmsys::SystemTools::FileExists((string *)local_1a8);
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != paVar17) {
      operator_delete(local_248._M_dataplus._M_p,
                      CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                               local_248.field_2._M_local_buf[0]) + 1);
    }
    if (bVar8) {
      pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      local_248._M_dataplus._M_p = (pointer)paVar17;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"PurifyCommand","");
      cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_248);
      std::__cxx11::string::operator=((string *)psVar1,(string *)local_1a8);
      if (local_1a8 != (undefined1  [8])local_198) {
        operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != paVar17) {
        operator_delete(local_248._M_dataplus._M_p,
                        CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                 local_248.field_2._M_local_buf[0]) + 1);
      }
      this->MemoryTesterStyle = 2;
    }
    else {
      pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      local_248._M_dataplus._M_p = (pointer)paVar17;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"ValgrindCommand","");
      cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_248);
      bVar8 = cmsys::SystemTools::FileExists((string *)local_1a8);
      if (local_1a8 != (undefined1  [8])local_198) {
        operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != paVar17) {
        operator_delete(local_248._M_dataplus._M_p,
                        CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                 local_248.field_2._M_local_buf[0]) + 1);
      }
      if (bVar8) {
        pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        local_248._M_dataplus._M_p = (pointer)paVar17;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"ValgrindCommand","");
        cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_248);
        std::__cxx11::string::operator=((string *)psVar1,(string *)local_1a8);
        if (local_1a8 != (undefined1  [8])local_198) {
          operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != paVar17) {
          operator_delete(local_248._M_dataplus._M_p,
                          CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                   local_248.field_2._M_local_buf[0]) + 1);
        }
        this->MemoryTesterStyle = 1;
      }
      else {
        pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        local_248._M_dataplus._M_p = (pointer)paVar17;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"DrMemoryCommand","");
        cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_248);
        bVar8 = cmsys::SystemTools::FileExists((string *)local_1a8);
        if (local_1a8 != (undefined1  [8])local_198) {
          operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != paVar17) {
          operator_delete(local_248._M_dataplus._M_p,
                          CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                   local_248.field_2._M_local_buf[0]) + 1);
        }
        if (bVar8) {
          pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
          local_248._M_dataplus._M_p = (pointer)paVar17;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"DrMemoryCommand","")
          ;
          cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_248);
          std::__cxx11::string::operator=((string *)psVar1,(string *)local_1a8);
          if (local_1a8 != (undefined1  [8])local_198) {
            operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != paVar17) {
            operator_delete(local_248._M_dataplus._M_p,
                            CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                     local_248.field_2._M_local_buf[0]) + 1);
          }
          this->MemoryTesterStyle = 3;
        }
        else {
          pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
          local_248._M_dataplus._M_p = (pointer)paVar17;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_248,"BoundsCheckerCommand","");
          cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_248);
          bVar8 = cmsys::SystemTools::FileExists((string *)local_1a8);
          if (local_1a8 != (undefined1  [8])local_198) {
            operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != paVar17) {
            operator_delete(local_248._M_dataplus._M_p,
                            CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                     local_248.field_2._M_local_buf[0]) + 1);
          }
          if (bVar8) {
            pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
            local_248._M_dataplus._M_p = (pointer)paVar17;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_248,"BoundsCheckerCommand","");
            cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_248);
            std::__cxx11::string::operator=((string *)psVar1,(string *)local_1a8);
            if (local_1a8 != (undefined1  [8])local_198) {
              operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != paVar17) {
              operator_delete(local_248._M_dataplus._M_p,
                              CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                       local_248.field_2._M_local_buf[0]) + 1);
            }
            this->MemoryTesterStyle = 4;
          }
          else {
            pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
            local_248._M_dataplus._M_p = (pointer)paVar17;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_248,"CudaSanitizerCommand","");
            cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_248);
            bVar8 = cmsys::SystemTools::FileExists((string *)local_1a8);
            if (local_1a8 != (undefined1  [8])local_198) {
              operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != paVar17) {
              operator_delete(local_248._M_dataplus._M_p,
                              CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                       local_248.field_2._M_local_buf[0]) + 1);
            }
            if (bVar8) {
              pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
              local_248._M_dataplus._M_p = (pointer)paVar17;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_248,"CudaSanitizerCommand","");
              cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_248);
              std::__cxx11::string::operator=((string *)psVar1,(string *)local_1a8);
              if (local_1a8 != (undefined1  [8])local_198) {
                operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._M_dataplus._M_p != paVar17) {
                operator_delete(local_248._M_dataplus._M_p,
                                CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                         local_248.field_2._M_local_buf[0]) + 1);
              }
              this->MemoryTesterStyle = 5;
            }
          }
        }
      }
    }
  }
  pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  local_248._M_dataplus._M_p = (pointer)paVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"MemoryCheckType","");
  cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_248);
  iVar10 = std::__cxx11::string::compare(local_1a8);
  if (local_1a8 != (undefined1  [8])local_198) {
    operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar17) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                             local_248.field_2._M_local_buf[0]) + 1);
  }
  if (iVar10 == 0) {
    cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::__cxx11::string::_M_assign((string *)psVar1);
    this->MemoryTesterStyle = 6;
    this->LogWithPID = true;
  }
  pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  local_248._M_dataplus._M_p = (pointer)paVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"MemoryCheckType","");
  cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_248);
  iVar10 = std::__cxx11::string::compare(local_1a8);
  if (local_1a8 != (undefined1  [8])local_198) {
    operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar17) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                             local_248.field_2._M_local_buf[0]) + 1);
  }
  if (iVar10 == 0) {
    cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::__cxx11::string::_M_assign((string *)psVar1);
    this->MemoryTesterStyle = 7;
    this->LogWithPID = true;
  }
  pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  local_248._M_dataplus._M_p = (pointer)paVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"MemoryCheckType","");
  cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_248);
  iVar10 = std::__cxx11::string::compare(local_1a8);
  if (local_1a8 != (undefined1  [8])local_198) {
    operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar17) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                             local_248.field_2._M_local_buf[0]) + 1);
  }
  if (iVar10 == 0) {
    cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::__cxx11::string::_M_assign((string *)psVar1);
    this->MemoryTesterStyle = 8;
    this->LogWithPID = true;
  }
  pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  local_248._M_dataplus._M_p = (pointer)paVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"MemoryCheckType","");
  cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_248);
  iVar10 = std::__cxx11::string::compare(local_1a8);
  if (local_1a8 != (undefined1  [8])local_198) {
    operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar17) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                             local_248.field_2._M_local_buf[0]) + 1);
  }
  if (iVar10 == 0) {
    cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::__cxx11::string::_M_assign((string *)psVar1);
    this->MemoryTesterStyle = 9;
    this->LogWithPID = true;
  }
  pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  local_248._M_dataplus._M_p = (pointer)paVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"MemoryCheckType","");
  cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_248);
  iVar10 = std::__cxx11::string::compare(local_1a8);
  if (local_1a8 != (undefined1  [8])local_198) {
    operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar17) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                             local_248.field_2._M_local_buf[0]) + 1);
  }
  if (iVar10 == 0) {
    cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::__cxx11::string::_M_assign((string *)psVar1);
    this->MemoryTesterStyle = 10;
    this->LogWithPID = true;
  }
  else if (this->MemoryTesterStyle == 0) {
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_248._M_dataplus._M_p = (pointer)paVar17;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"MemoryCheckType","");
    cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != paVar17) {
      operator_delete(local_248._M_dataplus._M_p,
                      CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                               local_248.field_2._M_local_buf[0]) + 1);
    }
    iVar10 = std::__cxx11::string::compare(local_1a8);
    if (iVar10 == 0) {
      iVar10 = 2;
LAB_001c5fff:
      this->MemoryTesterStyle = iVar10;
    }
    else {
      iVar10 = std::__cxx11::string::compare(local_1a8);
      if (iVar10 == 0) {
        iVar10 = 4;
        goto LAB_001c5fff;
      }
      iVar10 = std::__cxx11::string::compare(local_1a8);
      if (iVar10 == 0) {
        iVar10 = 1;
        goto LAB_001c5fff;
      }
      iVar10 = std::__cxx11::string::compare(local_1a8);
      if (iVar10 == 0) {
        iVar10 = 3;
        goto LAB_001c5fff;
      }
      iVar10 = std::__cxx11::string::compare(local_1a8);
      if (iVar10 == 0) {
        iVar10 = 5;
        goto LAB_001c5fff;
      }
    }
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
    }
  }
  if ((this->MemoryTester)._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Memory checker (MemoryCheckCommand) not set, or cannot find the specified program.",
               0x52);
    std::ios::widen((char)(ostringstream *)local_1a8 +
                    (char)*(undefined8 *)((long)local_1a8 + -0x18));
    std::ostream::put((char)local_1a8);
    std::ostream::flush();
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar5,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                 ,0x228,local_248._M_dataplus._M_p,
                 (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != paVar17) {
      operator_delete(local_248._M_dataplus._M_p,
                      CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                               local_248.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    return false;
  }
  local_248._M_string_length = 0;
  local_248.field_2._M_local_buf[0] = '\0';
  pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  local_248._M_dataplus._M_p = (pointer)paVar17;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"MemoryCheckCommandOptions","");
  cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_268);
  pbVar7 = pbStack_1a0;
  if (local_1a8 != (undefined1  [8])local_198) {
    operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,(ulong)(local_268.field_2._M_allocated_capacity + 1))
    ;
  }
  if (pbVar7 == (pointer)0x0) {
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"ValgrindCommandOptions","");
    cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_268);
    pbVar7 = pbStack_1a0;
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,
                      (ulong)(local_268.field_2._M_allocated_capacity + 1));
    }
    if (pbVar7 != (pointer)0x0) {
      pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_268,"ValgrindCommandOptions","");
      cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_268);
      goto LAB_001c640a;
    }
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"DrMemoryCommandOptions","");
    cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_268);
    pbVar7 = pbStack_1a0;
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,
                      (ulong)(local_268.field_2._M_allocated_capacity + 1));
    }
    if (pbVar7 != (pointer)0x0) {
      pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_268,"DrMemoryCommandOptions","");
      cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_268);
      goto LAB_001c640a;
    }
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"CudaSanitizerCommandOptions","");
    cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_268);
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,
                      (ulong)(local_268.field_2._M_allocated_capacity + 1));
    }
    if (pbStack_1a0 != (pointer)0x0) {
      pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_268,"CudaSanitizerCommandOptions","");
      cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_268);
      goto LAB_001c640a;
    }
  }
  else {
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"MemoryCheckCommandOptions","");
    cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_268);
LAB_001c640a:
    std::__cxx11::string::operator=((string *)&local_248,(string *)local_1a8);
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,
                      (ulong)(local_268.field_2._M_allocated_capacity + 1));
    }
  }
  cmSystemTools::ParseArguments
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_268,&local_248);
  local_198[0]._0_8_ =
       (this->MemoryTesterOptions).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->MemoryTesterOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_268.field_2._M_allocated_capacity;
  local_1a8 = (undefined1  [8])
              (this->MemoryTesterOptions).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pbStack_1a0 = (this->MemoryTesterOptions).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (this->MemoryTesterOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_268._M_dataplus._M_p;
  (this->MemoryTesterOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_268._M_string_length;
  local_268._M_dataplus._M_p = (pointer)0x0;
  local_268._M_string_length = 0;
  local_268.field_2._M_allocated_capacity = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_268);
  cmCTest::GetBinaryDir_abi_cxx11_
            (&local_268,(this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest);
  plVar13 = (long *)std::__cxx11::string::append((char *)&local_268);
  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar13 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar13 == paVar17) {
    local_198[0]._0_8_ = paVar17->_M_allocated_capacity;
    local_198[0]._8_8_ = plVar13[3];
    local_1a8 = (undefined1  [8])local_198;
  }
  else {
    local_198[0]._0_8_ = paVar17->_M_allocated_capacity;
    local_1a8 = (undefined1  [8])*plVar13;
  }
  pbStack_1a0 = (pointer)plVar13[1];
  *plVar13 = (long)paVar17;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  psVar1 = &this->MemoryTesterOutputFile;
  std::__cxx11::string::operator=((string *)psVar1,(string *)local_1a8);
  if (local_1a8 != (undefined1  [8])local_198) {
    operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  iVar10 = this->MemoryTesterStyle;
  if (9 < iVar10 - 1U) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Do not understand memory checker: ",0x22);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(this->MemoryTester)._M_dataplus._M_p,
                         (this->MemoryTester)._M_string_length);
    std::ios::widen((char)poVar14->_vptr_basic_ostream[-3] + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar5,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                 ,0x304,local_268._M_dataplus._M_p,false);
LAB_001c7602:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
LAB_001c763e:
    bVar8 = false;
    goto LAB_001c71fa;
  }
  this_00 = &this->MemoryTesterOptions;
  switch(iVar10) {
  case 1:
    if ((this->MemoryTesterOptions).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->MemoryTesterOptions).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[3]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [3])0x7b960d);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[16]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [16])"--tool=memcheck");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[17]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [17])"--leak-check=yes");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[21]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [21])"--show-reachable=yes");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[17]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [17])"--num-callers=50");
    }
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"MemoryCheckSuppressionFile","");
    cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_268);
    pbVar7 = pbStack_1a0;
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if (pbVar7 != (pointer)0x0) {
      pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_268,"MemoryCheckSuppressionFile","");
      cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_268);
      bVar8 = cmsys::SystemTools::FileExists((string *)local_1a8);
      if (local_1a8 != (undefined1  [8])local_198) {
        operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      if (!bVar8) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Cannot find memory checker suppression file: ",0x2d);
        pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_228,"MemoryCheckSuppressionFile","");
        cmCTest::GetCTestConfiguration(&local_268,pcVar5,&local_228);
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,local_268._M_dataplus._M_p,
                             local_268._M_string_length);
        std::endl<char,std::char_traits<char>>(poVar14);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,
                          CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                                   local_228.field_2._M_local_buf[0]) + 1);
        }
        pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar5,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                     ,0x256,local_268._M_dataplus._M_p,false);
        goto LAB_001c7602;
      }
      pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_228,"MemoryCheckSuppressionFile","");
      cmCTest::GetCTestConfiguration(&local_268,pcVar5,&local_228);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                     "--suppressions=",&local_268);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
      if (local_1a8 != (undefined1  [8])local_198) {
        operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,
                        CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                                 local_228.field_2._M_local_buf[0]) + 1);
      }
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "--log-file=",psVar1);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->MemoryTesterDynamicOptions,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
    break;
  case 2:
    local_1a8 = (undefined1  [8])local_198;
    pbStack_1a0 = (pointer)0x0;
    local_198[0]._M_allocated_capacity = local_198[0]._M_allocated_capacity & 0xffffffffffffff00;
    std::__cxx11::string::_M_replace((ulong)local_1a8,0,(char *)0x0,0x74284a);
    std::__cxx11::string::_M_append
              (local_1a8,(ulong)(this->MemoryTesterOutputFile)._M_dataplus._M_p);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->MemoryTesterDynamicOptions,(value_type *)local_1a8);
    break;
  case 3:
    cmCTest::GetBinaryDir_abi_cxx11_
              ((string *)local_1a8,
               (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest);
    plVar13 = (long *)std::__cxx11::string::append(local_1a8);
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    puVar19 = (ulong *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar19) {
      local_268.field_2._M_allocated_capacity = *puVar19;
      local_268.field_2._8_8_ = plVar13[3];
    }
    else {
      local_268.field_2._M_allocated_capacity = *puVar19;
      local_268._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_268._M_string_length = plVar13[1];
    *plVar13 = (long)puVar19;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
    }
    _Var15 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[7]>>
                       ((this->MemoryTesterOptions).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (this->MemoryTesterOptions).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,"-quiet");
    pbVar20 = (this->MemoryTesterOptions).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (_Var15._M_current == pbVar20) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[7]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [7])0x73d791);
      pbVar20 = (this->MemoryTesterOptions).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    _Var15 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[7]>>
                       ((this_00->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start,pbVar20,"-batch");
    if (_Var15._M_current ==
        (this->MemoryTesterOptions).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[7]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [7])"-batch");
    }
    pvVar2 = &this->MemoryTesterDynamicOptions;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[8]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar2,
               (char (*) [8])"-logdir");
    _Var16 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[8]>>
                       ((this->MemoryTesterOptions).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (this->MemoryTesterOptions).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,"-logdir");
    if (_Var16._M_current ==
        (this->MemoryTesterOptions).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_1a8 = (undefined1  [8])local_198;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a8,local_268._M_dataplus._M_p,
                 local_268._M_dataplus._M_p + local_268._M_string_length);
      std::__cxx11::string::append(local_1a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar2,(value_type *)local_1a8);
      std::__cxx11::string::_M_assign((string *)psVar1);
      if (local_1a8 != (undefined1  [8])local_198) {
        operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar2,_Var16._M_current + 1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase(this_00,(iterator)_Var16._M_current,_Var16._M_current + 2);
    }
    std::__cxx11::string::append((char *)psVar1);
    _Var16 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[14]>>
                       ((this->MemoryTesterOptions).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (this->MemoryTesterOptions).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,"-symcache_dir");
    if (_Var16._M_current ==
        (this->MemoryTesterOptions).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[14]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar2,
                 (char (*) [14])"-symcache_dir");
      local_1a8 = (undefined1  [8])local_198;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a8,local_268._M_dataplus._M_p,
                 local_268._M_dataplus._M_p + local_268._M_string_length);
      std::__cxx11::string::append(local_1a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar2,(value_type *)local_1a8);
      if (local_1a8 != (undefined1  [8])local_198) {
        operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
      }
    }
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    paVar17 = &local_228.field_2;
    local_228._M_dataplus._M_p = (pointer)paVar17;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_228,"MemoryCheckSuppressionFile","");
    cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_228);
    pbVar7 = pbStack_1a0;
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != paVar17) {
      operator_delete(local_228._M_dataplus._M_p,
                      CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                               local_228.field_2._M_local_buf[0]) + 1);
    }
    if (pbVar7 != (pointer)0x0) {
      pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      local_228._M_dataplus._M_p = (pointer)paVar17;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_228,"MemoryCheckSuppressionFile","");
      cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_228);
      bVar8 = cmsys::SystemTools::FileExists((string *)local_1a8);
      if (local_1a8 != (undefined1  [8])local_198) {
        operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != paVar17) {
        operator_delete(local_228._M_dataplus._M_p,
                        CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                                 local_228.field_2._M_local_buf[0]) + 1);
      }
      if (!bVar8) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Cannot find memory checker suppression file: ",0x2d);
        pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e8,"MemoryCheckSuppressionFile","");
        cmCTest::GetCTestConfiguration(&local_228,pcVar5,&local_1e8);
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,local_228._M_dataplus._M_p,
                             local_228._M_string_length);
        std::endl<char,std::char_traits<char>>(poVar14);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != paVar17) {
          operator_delete(local_228._M_dataplus._M_p,
                          CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                                   local_228.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar5,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                     ,0x28f,local_228._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != paVar17) {
          operator_delete(local_228._M_dataplus._M_p,
                          CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                                   local_228.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        goto LAB_001c763e;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[10]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [10])"-suppress");
      pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      local_228._M_dataplus._M_p = (pointer)paVar17;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_228,"MemoryCheckSuppressionFile","");
      cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_228);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
      if (local_1a8 != (undefined1  [8])local_198) {
        operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != paVar17) {
        operator_delete(local_228._M_dataplus._M_p,
                        CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                                 local_228.field_2._M_local_buf[0]) + 1);
      }
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (char (*) [3])0x7a0f87);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    goto LAB_001c71ef;
  case 4:
    std::__cxx11::string::_M_assign((string *)&this->BoundsCheckerXMLFile);
    cmCTest::GetBinaryDir_abi_cxx11_
              (&local_268,(this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest);
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_268);
    local_1a8 = (undefined1  [8])local_198;
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 == paVar17) {
      local_198[0]._0_8_ = paVar17->_M_allocated_capacity;
      local_198[0]._8_8_ = plVar13[3];
    }
    else {
      local_198[0]._0_8_ = paVar17->_M_allocated_capacity;
      local_1a8 = (undefined1  [8])*plVar13;
    }
    pbStack_1a0 = (pointer)plVar13[1];
    *plVar13 = (long)paVar17;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_assign((string *)&this->BoundsCheckerDPBDFile);
    pvVar2 = &this->MemoryTesterDynamicOptions;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar2,
               (char (*) [3])"/B");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar2,
               (char (*) [3])"/X");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar2,psVar1);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (char (*) [3])"/M");
    break;
  case 5:
    if ((this->MemoryTesterOptions).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->MemoryTesterOptions).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[7]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [7])"--tool");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[9]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [9])0x73ddce);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[13]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [13])"--leak-check");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[5]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [5])0x785308);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[11]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->MemoryTesterDynamicOptions,(char (*) [11])"--log-file");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->MemoryTesterDynamicOptions,psVar1);
    goto LAB_001c71ef;
  default:
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->MemoryTesterDynamicOptions,(char (*) [3])"-E");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[4]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->MemoryTesterDynamicOptions,(char (*) [4])0x74a0c0);
    local_1a8 = (undefined1  [8])local_198;
    pbStack_1a0 = (pointer)0x0;
    local_198[0]._M_allocated_capacity = local_198[0]._M_allocated_capacity & 0xffffffffffffff00;
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    local_268._M_string_length = 0;
    local_268.field_2._M_allocated_capacity =
         local_268.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    local_228._M_string_length = 0;
    local_228.field_2._M_local_buf[0] = '\0';
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    paVar17 = &local_208.field_2;
    local_208._M_dataplus._M_p = (pointer)paVar17;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_208,"MemoryCheckSanitizerOptions","");
    cmCTest::GetCTestConfiguration(&local_1e8,pcVar5,&local_208);
    sVar6 = local_1e8._M_string_length;
    paVar3 = &local_1e8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar3) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar17) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if (sVar6 != 0) {
      pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1c8,"MemoryCheckSanitizerOptions","");
      cmCTest::GetCTestConfiguration(&local_208,pcVar5,&local_1c8);
      plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,0x7815e7);
      psVar18 = (size_type *)(plVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar18) {
        local_1e8.field_2._M_allocated_capacity = *psVar18;
        local_1e8.field_2._8_8_ = plVar13[3];
        local_1e8._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_1e8.field_2._M_allocated_capacity = *psVar18;
        local_1e8._M_dataplus._M_p = (pointer)*plVar13;
      }
      local_1e8._M_string_length = plVar13[1];
      *plVar13 = (long)psVar18;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_268,(string *)&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != paVar3) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar17) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
    }
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_208._M_dataplus._M_p = (pointer)paVar17;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_208,"MemoryCheckSuppressionFile","");
    cmCTest::GetCTestConfiguration(&local_1e8,pcVar5,&local_208);
    sVar6 = local_1e8._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar3) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar17) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if (sVar6 != 0) {
      pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1c8,"MemoryCheckSuppressionFile","");
      cmCTest::GetCTestConfiguration(&local_208,pcVar5,&local_1c8);
      plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,0x742909);
      psVar18 = (size_type *)(plVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar18) {
        local_1e8.field_2._M_allocated_capacity = *psVar18;
        local_1e8.field_2._8_8_ = plVar13[3];
        local_1e8._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_1e8.field_2._M_allocated_capacity = *psVar18;
        local_1e8._M_dataplus._M_p = (pointer)*plVar13;
      }
      local_1e8._M_string_length = plVar13[1];
      *plVar13 = (long)psVar18;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_228,(string *)&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != paVar3) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar17) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
    }
    uVar11 = this->MemoryTesterStyle - 6;
    if (uVar11 < 5) {
      std::__cxx11::string::_M_replace
                ((ulong)local_1a8,0,(char *)pbStack_1a0,
                 (ulong)(&DAT_00742234 + *(int *)(&DAT_00742234 + (ulong)uVar11 * 4)));
    }
    paVar4 = &local_1c8.field_2;
    local_1c8._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c8,local_1a8,
               (char *)((long)local_1a8 + (long)&pbStack_1a0->_M_dataplus));
    std::__cxx11::string::append((char *)&local_1c8);
    plVar13 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_1c8,
                                 (ulong)(this->MemoryTesterOutputFile)._M_dataplus._M_p);
    psVar18 = (size_type *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_208.field_2._M_allocated_capacity = *psVar18;
      local_208.field_2._8_8_ = plVar13[3];
      local_208._M_dataplus._M_p = (pointer)paVar17;
    }
    else {
      local_208.field_2._M_allocated_capacity = *psVar18;
      local_208._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_208._M_string_length = plVar13[1];
    *plVar13 = (long)psVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_208);
    psVar18 = (size_type *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_1e8.field_2._M_allocated_capacity = *psVar18;
      local_1e8.field_2._8_8_ = plVar13[3];
      local_1e8._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *psVar18;
      local_1e8._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_1e8._M_string_length = plVar13[1];
    *plVar13 = (long)psVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar17) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != paVar4) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_1c8,&local_1e8,&local_228);
    plVar13 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_1c8,(ulong)local_268._M_dataplus._M_p);
    psVar18 = (size_type *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_208.field_2._M_allocated_capacity = *psVar18;
      local_208.field_2._8_8_ = plVar13[3];
      local_208._M_dataplus._M_p = (pointer)paVar17;
    }
    else {
      local_208.field_2._M_allocated_capacity = *psVar18;
      local_208._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_208._M_string_length = plVar13[1];
    *plVar13 = (long)psVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::__cxx11::string::operator=
              ((string *)&this->MemoryTesterEnvironmentVariable,(string *)&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar17) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != paVar4) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar3) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,
                      CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                               local_228.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_1a8 != (undefined1  [8])local_198) {
    operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
  }
LAB_001c71ef:
  bVar8 = true;
  InitializeResultsVectors(this);
LAB_001c71fa:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                             local_248.field_2._M_local_buf[0]) + 1);
  }
  return bVar8;
}

Assistant:

bool cmCTestMemCheckHandler::InitializeMemoryChecking()
{
  this->MemoryTesterEnvironmentVariable.clear();
  this->MemoryTester.clear();
  // Setup the command
  if (cmSystemTools::FileExists(
        this->CTest->GetCTestConfiguration("MemoryCheckCommand"))) {
    this->MemoryTester =
      this->CTest->GetCTestConfiguration("MemoryCheckCommand");
    std::string testerName =
      cmSystemTools::GetFilenameName(this->MemoryTester);
    // determine the checker type
    if (testerName.find("valgrind") != std::string::npos ||
        this->CTest->GetCTestConfiguration("MemoryCheckType") == "Valgrind") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::VALGRIND;
    } else if (testerName.find("drmemory") != std::string::npos ||
               this->CTest->GetCTestConfiguration("MemoryCheckType") ==
                 "DrMemory") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::DRMEMORY;
    } else if (testerName.find("purify") != std::string::npos) {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::PURIFY;
    } else if (testerName.find("BC") != std::string::npos) {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::BOUNDS_CHECKER;
    } else if (testerName.find("cuda-memcheck") != std::string::npos ||
               testerName.find("compute-sanitizer") != std::string::npos) {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::CUDA_SANITIZER;
    } else {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::UNKNOWN;
    }
  } else if (cmSystemTools::FileExists(
               this->CTest->GetCTestConfiguration("PurifyCommand"))) {
    this->MemoryTester = this->CTest->GetCTestConfiguration("PurifyCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::PURIFY;
  } else if (cmSystemTools::FileExists(
               this->CTest->GetCTestConfiguration("ValgrindCommand"))) {
    this->MemoryTester = this->CTest->GetCTestConfiguration("ValgrindCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::VALGRIND;
  } else if (cmSystemTools::FileExists(
               this->CTest->GetCTestConfiguration("DrMemoryCommand"))) {
    this->MemoryTester = this->CTest->GetCTestConfiguration("DrMemoryCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::DRMEMORY;
  } else if (cmSystemTools::FileExists(
               this->CTest->GetCTestConfiguration("BoundsCheckerCommand"))) {
    this->MemoryTester =
      this->CTest->GetCTestConfiguration("BoundsCheckerCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::BOUNDS_CHECKER;
  } else if (cmSystemTools::FileExists(
               this->CTest->GetCTestConfiguration("CudaSanitizerCommand"))) {
    this->MemoryTester =
      this->CTest->GetCTestConfiguration("CudaSanitizerCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::CUDA_SANITIZER;
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "AddressSanitizer") {
    this->MemoryTester = cmSystemTools::GetCMakeCommand();
    this->MemoryTesterStyle = cmCTestMemCheckHandler::ADDRESS_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "LeakSanitizer") {
    this->MemoryTester = cmSystemTools::GetCMakeCommand();
    this->MemoryTesterStyle = cmCTestMemCheckHandler::LEAK_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "ThreadSanitizer") {
    this->MemoryTester = cmSystemTools::GetCMakeCommand();
    this->MemoryTesterStyle = cmCTestMemCheckHandler::THREAD_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "MemorySanitizer") {
    this->MemoryTester = cmSystemTools::GetCMakeCommand();
    this->MemoryTesterStyle = cmCTestMemCheckHandler::MEMORY_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "UndefinedBehaviorSanitizer") {
    this->MemoryTester = cmSystemTools::GetCMakeCommand();
    this->MemoryTesterStyle = cmCTestMemCheckHandler::UB_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  // Check the MemoryCheckType
  if (this->MemoryTesterStyle == cmCTestMemCheckHandler::UNKNOWN) {
    std::string checkType =
      this->CTest->GetCTestConfiguration("MemoryCheckType");
    if (checkType == "Purify") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::PURIFY;
    } else if (checkType == "BoundsChecker") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::BOUNDS_CHECKER;
    } else if (checkType == "Valgrind") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::VALGRIND;
    } else if (checkType == "DrMemory") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::DRMEMORY;
    } else if (checkType == "CudaSanitizer") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::CUDA_SANITIZER;
    }
  }
  if (this->MemoryTester.empty()) {
    cmCTestOptionalLog(this->CTest, WARNING,
                       "Memory checker (MemoryCheckCommand) "
                       "not set, or cannot find the specified program."
                         << std::endl,
                       this->Quiet);
    return false;
  }

  // Setup the options
  std::string memoryTesterOptions;
  if (!this->CTest->GetCTestConfiguration("MemoryCheckCommandOptions")
         .empty()) {
    memoryTesterOptions =
      this->CTest->GetCTestConfiguration("MemoryCheckCommandOptions");
  } else if (!this->CTest->GetCTestConfiguration("ValgrindCommandOptions")
                .empty()) {
    memoryTesterOptions =
      this->CTest->GetCTestConfiguration("ValgrindCommandOptions");
  } else if (!this->CTest->GetCTestConfiguration("DrMemoryCommandOptions")
                .empty()) {
    memoryTesterOptions =
      this->CTest->GetCTestConfiguration("DrMemoryCommandOptions");
  } else if (!this->CTest->GetCTestConfiguration("CudaSanitizerCommandOptions")
                .empty()) {
    memoryTesterOptions =
      this->CTest->GetCTestConfiguration("CudaSanitizerCommandOptions");
  }
  this->MemoryTesterOptions =
    cmSystemTools::ParseArguments(memoryTesterOptions);

  this->MemoryTesterOutputFile =
    this->CTest->GetBinaryDir() + "/Testing/Temporary/MemoryChecker.??.log";

  switch (this->MemoryTesterStyle) {
    case cmCTestMemCheckHandler::VALGRIND: {
      if (this->MemoryTesterOptions.empty()) {
        this->MemoryTesterOptions.emplace_back("-q");
        this->MemoryTesterOptions.emplace_back("--tool=memcheck");
        this->MemoryTesterOptions.emplace_back("--leak-check=yes");
        this->MemoryTesterOptions.emplace_back("--show-reachable=yes");
        this->MemoryTesterOptions.emplace_back("--num-callers=50");
      }
      if (!this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile")
             .empty()) {
        if (!cmSystemTools::FileExists(this->CTest->GetCTestConfiguration(
              "MemoryCheckSuppressionFile"))) {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Cannot find memory checker suppression file: "
                       << this->CTest->GetCTestConfiguration(
                            "MemoryCheckSuppressionFile")
                       << std::endl);
          return false;
        }
        this->MemoryTesterOptions.push_back(
          "--suppressions=" +
          this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile"));
      }
      this->MemoryTesterDynamicOptions.push_back("--log-file=" +
                                                 this->MemoryTesterOutputFile);
      break;
    }
    case cmCTestMemCheckHandler::DRMEMORY: {
      std::string tempDrMemoryDir =
        this->CTest->GetBinaryDir() + "/Testing/Temporary/DrMemory";

      if (!cm::contains(this->MemoryTesterOptions, "-quiet")) {
        this->MemoryTesterOptions.emplace_back("-quiet");
      }

      if (!cm::contains(this->MemoryTesterOptions, "-batch")) {
        this->MemoryTesterOptions.emplace_back("-batch");
      }

      this->MemoryTesterDynamicOptions.emplace_back("-logdir");
      auto logdirOption =
        std::find(this->MemoryTesterOptions.begin(),
                  this->MemoryTesterOptions.end(), "-logdir");
      if (logdirOption == this->MemoryTesterOptions.end()) {
        // No logdir found in memory tester options
        std::string drMemoryLogDir = tempDrMemoryDir + "/??";
        this->MemoryTesterDynamicOptions.push_back(drMemoryLogDir);
        this->MemoryTesterOutputFile = drMemoryLogDir;
      } else {
        // Use logdir found in memory tester options
        auto logdirLocation = std::next(logdirOption);
        this->MemoryTesterOutputFile = *logdirLocation;
        this->MemoryTesterDynamicOptions.push_back(*logdirLocation);
        this->MemoryTesterOptions.erase(logdirOption, logdirLocation + 1);
      }
      this->MemoryTesterOutputFile += "/*/results.txt";

      if (std::find(this->MemoryTesterOptions.begin(),
                    this->MemoryTesterOptions.end(),
                    "-symcache_dir") == this->MemoryTesterOptions.end()) {
        this->MemoryTesterDynamicOptions.emplace_back("-symcache_dir");
        std::string drMemoryCacheDir = tempDrMemoryDir + "/cache";
        this->MemoryTesterDynamicOptions.push_back(drMemoryCacheDir);
      }

      if (!this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile")
             .empty()) {
        if (!cmSystemTools::FileExists(this->CTest->GetCTestConfiguration(
              "MemoryCheckSuppressionFile"))) {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Cannot find memory checker suppression file: "
                       << this->CTest->GetCTestConfiguration(
                            "MemoryCheckSuppressionFile")
                       << std::endl);
          return false;
        }
        this->MemoryTesterOptions.emplace_back("-suppress");
        this->MemoryTesterOptions.push_back(
          this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile"));
      }

      this->MemoryTesterOptions.emplace_back("--");

      break;
    }
    case cmCTestMemCheckHandler::PURIFY: {
      std::string outputFile;
#ifdef _WIN32
      if (this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile")
            .size()) {
        if (!cmSystemTools::FileExists(this->CTest->GetCTestConfiguration(
              "MemoryCheckSuppressionFile"))) {
          cmCTestLog(
            this->CTest, ERROR_MESSAGE,
            "Cannot find memory checker suppression file: "
              << this->CTest
                   ->GetCTestConfiguration("MemoryCheckSuppressionFile")
                   .c_str()
              << std::endl);
          return false;
        }
        std::string filterFiles = "/FilterFiles=" +
          this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile");
        this->MemoryTesterOptions.push_back(filterFiles);
      }
      outputFile = "/SAVETEXTDATA=";
#else
      outputFile = "-log-file=";
#endif
      outputFile += this->MemoryTesterOutputFile;
      this->MemoryTesterDynamicOptions.push_back(outputFile);
      break;
    }
    case cmCTestMemCheckHandler::BOUNDS_CHECKER: {
      this->BoundsCheckerXMLFile = this->MemoryTesterOutputFile;
      std::string dpbdFile = this->CTest->GetBinaryDir() +
        "/Testing/Temporary/MemoryChecker.??.DPbd";
      this->BoundsCheckerDPBDFile = dpbdFile;
      this->MemoryTesterDynamicOptions.emplace_back("/B");
      this->MemoryTesterDynamicOptions.push_back(std::move(dpbdFile));
      this->MemoryTesterDynamicOptions.emplace_back("/X");
      this->MemoryTesterDynamicOptions.push_back(this->MemoryTesterOutputFile);
      this->MemoryTesterOptions.emplace_back("/M");
      break;
    }
    case cmCTestMemCheckHandler::CUDA_SANITIZER: {
      // cuda sanitizer separates flags from arguments by spaces
      if (this->MemoryTesterOptions.empty()) {
        this->MemoryTesterOptions.emplace_back("--tool");
        this->MemoryTesterOptions.emplace_back("memcheck");
        this->MemoryTesterOptions.emplace_back("--leak-check");
        this->MemoryTesterOptions.emplace_back("full");
      }
      this->MemoryTesterDynamicOptions.emplace_back("--log-file");
      this->MemoryTesterDynamicOptions.push_back(this->MemoryTesterOutputFile);
      break;
    }
    // these are almost the same but the env var used is different
    case cmCTestMemCheckHandler::ADDRESS_SANITIZER:
    case cmCTestMemCheckHandler::LEAK_SANITIZER:
    case cmCTestMemCheckHandler::THREAD_SANITIZER:
    case cmCTestMemCheckHandler::MEMORY_SANITIZER:
    case cmCTestMemCheckHandler::UB_SANITIZER: {
      // To pass arguments to ThreadSanitizer the environment variable
      // TSAN_OPTIONS is used. This is done with the cmake -E env command.
      // The MemoryTesterDynamicOptions is setup with the -E env
      // Then the MemoryTesterEnvironmentVariable gets the
      // TSAN_OPTIONS string with the log_path in it.
      this->MemoryTesterDynamicOptions.emplace_back("-E");
      this->MemoryTesterDynamicOptions.emplace_back("env");
      std::string envVar;
      std::string extraOptions;
      std::string suppressionsOption;
      if (!this->CTest->GetCTestConfiguration("MemoryCheckSanitizerOptions")
             .empty()) {
        extraOptions = ":" +
          this->CTest->GetCTestConfiguration("MemoryCheckSanitizerOptions");
      }
      if (!this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile")
             .empty()) {
        suppressionsOption = ":suppressions=" +
          this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile");
      }
      if (this->MemoryTesterStyle ==
          cmCTestMemCheckHandler::ADDRESS_SANITIZER) {
        envVar = "ASAN_OPTIONS";
      } else if (this->MemoryTesterStyle ==
                 cmCTestMemCheckHandler::LEAK_SANITIZER) {
        envVar = "LSAN_OPTIONS";
      } else if (this->MemoryTesterStyle ==
                 cmCTestMemCheckHandler::THREAD_SANITIZER) {
        envVar = "TSAN_OPTIONS";
      } else if (this->MemoryTesterStyle ==
                 cmCTestMemCheckHandler::MEMORY_SANITIZER) {
        envVar = "MSAN_OPTIONS";
      } else if (this->MemoryTesterStyle ==
                 cmCTestMemCheckHandler::UB_SANITIZER) {
        envVar = "UBSAN_OPTIONS";
      }
      // Quote log_path with single quotes; see
      // https://bugs.chromium.org/p/chromium/issues/detail?id=467936
      std::string outputFile =
        envVar + "=log_path='" + this->MemoryTesterOutputFile + "'";
      this->MemoryTesterEnvironmentVariable =
        outputFile + suppressionsOption + extraOptions;
      break;
    }
    default:
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Do not understand memory checker: " << this->MemoryTester
                                                      << std::endl);
      return false;
  }

  this->InitializeResultsVectors();
  // std::vector<std::string>::size_type cc;
  // for ( cc = 0; cmCTestMemCheckResultStrings[cc]; cc ++ )
  //   {
  //   this->MemoryTesterGlobalResults[cc] = 0;
  //   }
  return true;
}